

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::build(context_t *context,string *expr)

{
  bool bVar1;
  proxy *in_RDI;
  char *ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  expression_t tree;
  deque<char,_std::allocator<char>_> buff;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  proxy *this;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffff68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80 [2];
  tree_type<cs::token_base_*> in_stack_ffffffffffffff90;
  charset in_stack_ffffffffffffffbc;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffffc0;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  compiler_type *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  std::deque<char,_std::allocator<char>_>::deque((deque<char,_std::allocator<char>_> *)0x258066);
  cs::tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)&stack0xffffffffffffff90);
  local_80[0]._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(local_80);
    std::deque<char,_std::allocator<char>_>::push_back
              ((deque<char,_std::allocator<char>_> *)this,
               (value_type_conflict1 *)in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_80);
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x25810f);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x258117);
  cs::compiler_type::build_expr
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbc);
  any::make<cs::tree_type<cs::token_base*>,cs::tree_type<cs::token_base*>&>
            (in_stack_ffffffffffffff68);
  cs::tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x25814b);
  std::deque<char,_std::allocator<char>_>::~deque
            ((deque<char,_std::allocator<char>_> *)in_stack_ffffffffffffff90.mRoot);
  return (var)in_RDI;
}

Assistant:

var build(const context_t &context, const string &expr)
		{
			std::deque<char> buff;
			expression_t tree;
			for (auto &ch: expr)
				buff.push_back(ch);
			context->compiler->build_expr(buff, tree);
			return var::make<expression_t>(tree);
		}